

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary.cc
# Opt level: O2

void __thiscall prometheus::Summary::Observe(Summary *this,double value)

{
  std::mutex::lock(&this->mutex_);
  this->count_ = this->count_ + 1;
  this->sum_ = this->sum_ + value;
  detail::TimeWindowQuantiles::insert(&this->quantile_values_,value);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void Summary::Observe(const double value) {
  std::lock_guard<std::mutex> lock(mutex_);

  count_ += 1;
  sum_ += value;
  quantile_values_.insert(value);
}